

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError WebPMuxAssemble(WebPMux *mux,WebPData *assembled_data)

{
  uint8_t *dst_00;
  size_t sVar1;
  WebPMuxImage *wpi_list;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 *in_RSI;
  long in_RDI;
  WebPMuxError err;
  uint8_t *dst;
  uint8_t *data;
  size_t size;
  WebPChunk *in_stack_ffffffffffffffa0;
  WebPMux *in_stack_ffffffffffffffa8;
  uint64_t nmemb;
  undefined4 in_stack_ffffffffffffffc8;
  void *local_28;
  long local_20;
  WebPMuxError local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    memset(in_RSI,0,0x10);
    if (in_RDI == 0) {
      local_4 = WEBP_MUX_INVALID_ARGUMENT;
    }
    else {
      local_4 = MuxCleanup(in_stack_ffffffffffffffa8);
      if ((local_4 == WEBP_MUX_OK) &&
         (local_4 = CreateVP8XChunk((WebPMux *)CONCAT44(1,in_stack_ffffffffffffffc8)),
         local_4 == WEBP_MUX_OK)) {
        dst_00 = (uint8_t *)ChunkListDiskSize(in_stack_ffffffffffffffa0);
        sVar1 = ChunkListDiskSize(in_stack_ffffffffffffffa0);
        wpi_list = (WebPMuxImage *)(dst_00 + sVar1);
        sVar1 = ChunkListDiskSize((WebPChunk *)wpi_list);
        nmemb = (long)&wpi_list->header_ + sVar1;
        sVar1 = ImageListDiskSize(wpi_list);
        lVar2 = nmemb + sVar1;
        sVar1 = ChunkListDiskSize((WebPChunk *)wpi_list);
        sVar3 = ChunkListDiskSize((WebPChunk *)wpi_list);
        sVar4 = ChunkListDiskSize((WebPChunk *)wpi_list);
        local_20 = lVar2 + sVar1 + sVar3 + sVar4 + 0xc;
        local_28 = WebPSafeMalloc(nmemb,(size_t)wpi_list);
        if (local_28 == (void *)0x0) {
          local_4 = WEBP_MUX_MEMORY_ERROR;
        }
        else {
          MuxEmitRiffHeader((uint8_t *)wpi_list,(size_t)dst_00);
          ChunkListEmit((WebPChunk *)wpi_list,dst_00);
          ChunkListEmit((WebPChunk *)wpi_list,dst_00);
          ChunkListEmit((WebPChunk *)wpi_list,dst_00);
          ImageListEmit(wpi_list,dst_00);
          ChunkListEmit((WebPChunk *)wpi_list,dst_00);
          ChunkListEmit((WebPChunk *)wpi_list,dst_00);
          ChunkListEmit((WebPChunk *)wpi_list,dst_00);
          local_4 = MuxValidate((WebPMux *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
          if (local_4 != WEBP_MUX_OK) {
            WebPSafeFree((void *)0x107773);
            local_28 = (void *)0x0;
            local_20 = 0;
          }
          *in_RSI = local_28;
          in_RSI[1] = local_20;
        }
      }
    }
  }
  return local_4;
}

Assistant:

WebPMuxError WebPMuxAssemble(WebPMux* mux, WebPData* assembled_data) {
  size_t size = 0;
  uint8_t* data = NULL;
  uint8_t* dst = NULL;
  WebPMuxError err;

  if (assembled_data == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  // Clean up returned data, in case something goes wrong.
  memset(assembled_data, 0, sizeof(*assembled_data));

  if (mux == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Finalize mux.
  err = MuxCleanup(mux);
  if (err != WEBP_MUX_OK) return err;
  err = CreateVP8XChunk(mux);
  if (err != WEBP_MUX_OK) return err;

  // Allocate data.
  size = ChunkListDiskSize(mux->vp8x_) + ChunkListDiskSize(mux->iccp_)
       + ChunkListDiskSize(mux->anim_) + ImageListDiskSize(mux->images_)
       + ChunkListDiskSize(mux->exif_) + ChunkListDiskSize(mux->xmp_)
       + ChunkListDiskSize(mux->unknown_) + RIFF_HEADER_SIZE;

  data = (uint8_t*)WebPSafeMalloc(1ULL, size);
  if (data == NULL) return WEBP_MUX_MEMORY_ERROR;

  // Emit header & chunks.
  dst = MuxEmitRiffHeader(data, size);
  dst = ChunkListEmit(mux->vp8x_, dst);
  dst = ChunkListEmit(mux->iccp_, dst);
  dst = ChunkListEmit(mux->anim_, dst);
  dst = ImageListEmit(mux->images_, dst);
  dst = ChunkListEmit(mux->exif_, dst);
  dst = ChunkListEmit(mux->xmp_, dst);
  dst = ChunkListEmit(mux->unknown_, dst);
  assert(dst == data + size);

  // Validate mux.
  err = MuxValidate(mux);
  if (err != WEBP_MUX_OK) {
    WebPSafeFree(data);
    data = NULL;
    size = 0;
  }

  // Finalize data.
  assembled_data->bytes = data;
  assembled_data->size = size;

  return err;
}